

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O2

void another_clib_func(_func_void_void_ptr_int *callback,void *user)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"[another] before");
  std::endl<char,std::char_traits<char>>(poVar1);
  (*callback)(user,0xe9);
  poVar1 = std::operator<<((ostream *)&std::cout,"[another] after");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void another_clib_func(void (*callback)(void *user, int input), void *user) {
  std::cout << "[another] before" << std::endl;
  callback(user, 233);
  std::cout << "[another] after" << std::endl;
}